

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asdcp-test.cpp
# Opt level: O1

FileInfoWrapper<ASDCP::MPEG2::MXFReader,_MyVideoDescriptor> * __thiscall
FileInfoWrapper<ASDCP::MPEG2::MXFReader,_MyVideoDescriptor>::file_info
          (FileInfoWrapper<ASDCP::MPEG2::MXFReader,_MyVideoDescriptor> *this,CommandOptions *Options
          ,char *type_string,IFileReaderFactory *fileReaderFactory,FILE *stream)

{
  MXFReader Reader;
  WriterInfo WI;
  MyVideoDescriptor Desc;
  undefined1 auStack_208 [16];
  WriterInfo local_1f8;
  VideoDescriptor local_148;
  VideoDescriptor local_dc;
  
  if (type_string != (char *)0x0) {
    if (stream == (FILE *)0x0) {
      stream = (FILE *)_stdout;
    }
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
    if ((Options->verbose_flag != false) || (Options->showheader_flag == true)) {
      ASDCP::MPEG2::MXFReader::MXFReader((MXFReader *)auStack_208,fileReaderFactory);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_148,Options->filenames[0],(allocator<char> *)&local_dc);
      ASDCP::MPEG2::MXFReader::OpenRead((string *)(auStack_208 + 0x10));
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)(auStack_208 + 0x10));
      Kumu::Result_t::~Result_t((Result_t *)(auStack_208 + 0x10));
      if (local_148.EditRate != (Rational)&local_148.SampleRate.Denominator) {
        operator_delete((void *)local_148.EditRate,local_148._16_8_ + 1);
      }
      if (*(int *)this < 0) {
        if ((*(int *)this == ASDCP::RESULT_FORMAT) && (Options->showheader_flag == true)) {
          ASDCP::MPEG2::MXFReader::DumpHeaderMetadata((_IO_FILE *)auStack_208);
        }
      }
      else {
        fprintf(_stdout,"File essence type is %s.\n",type_string);
        if (Options->showheader_flag == true) {
          ASDCP::MPEG2::MXFReader::DumpHeaderMetadata((_IO_FILE *)auStack_208);
        }
        ASDCP::WriterInfo::WriterInfo((WriterInfo *)(auStack_208 + 0x10));
        ASDCP::MPEG2::MXFReader::FillWriterInfo((WriterInfo *)&stack0xffffffffffffff68);
        Kumu::Result_t::~Result_t((Result_t *)&stack0xffffffffffffff68);
        ASDCP::WriterInfoDump((WriterInfo *)(auStack_208 + 0x10),(_IO_FILE *)stream);
        local_dc.EditRate.Numerator = 0;
        local_dc.EditRate.Denominator = 0;
        local_dc.SampleRate.Numerator = 0;
        local_dc.SampleRate.Denominator = 0;
        local_dc.AspectRatio.Numerator = 0;
        local_dc.AspectRatio.Denominator = 0;
        ASDCP::MPEG2::MXFReader::FillVideoDescriptor(&local_148);
        Kumu::Result_t::~Result_t((Result_t *)&local_148);
        ASDCP::MPEG2::VideoDescriptorDump(&local_dc,(_IO_FILE *)stream);
        if (Options->showindex_flag == true) {
          ASDCP::MPEG2::MXFReader::DumpIndex((_IO_FILE *)auStack_208);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8.ProductName._M_dataplus._M_p != &local_1f8.ProductName.field_2) {
          operator_delete(local_1f8.ProductName._M_dataplus._M_p,
                          local_1f8.ProductName.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8.CompanyName._M_dataplus._M_p != &local_1f8.CompanyName.field_2) {
          operator_delete(local_1f8.CompanyName._M_dataplus._M_p,
                          local_1f8.CompanyName.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8.ProductVersion._M_dataplus._M_p != &local_1f8.ProductVersion.field_2) {
          operator_delete(local_1f8.ProductVersion._M_dataplus._M_p,
                          (ulong)(local_1f8.ProductVersion.field_2._M_allocated_capacity + 1));
        }
      }
      ASDCP::MPEG2::MXFReader::~MXFReader((MXFReader *)auStack_208);
    }
    return this;
  }
  __assert_fail("type_string",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/asdcp-test.cpp"
                ,0x6f0,
                "static Result_t FileInfoWrapper<ASDCP::MPEG2::MXFReader, MyVideoDescriptor>::file_info(CommandOptions &, const char *, const Kumu::IFileReaderFactory &, FILE *) [ReaderT = ASDCP::MPEG2::MXFReader, DescriptorT = MyVideoDescriptor]"
               );
}

Assistant:

static Result_t
  file_info(CommandOptions& Options, const char* type_string, const Kumu::IFileReaderFactory& fileReaderFactory, FILE* stream = 0)
  {
    assert(type_string);
    if ( stream == 0 )
      stream = stdout;

    Result_t result = RESULT_OK;

    if ( Options.verbose_flag || Options.showheader_flag )
      {
	ReaderT     Reader(fileReaderFactory);
	result = Reader.OpenRead(Options.filenames[0]);

	if ( ASDCP_SUCCESS(result) )
	  {
	    fprintf(stdout, "File essence type is %s.\n", type_string);

	    if ( Options.showheader_flag )
	      Reader.DumpHeaderMetadata(stream);

	    WriterInfo WI;
	    Reader.FillWriterInfo(WI);
	    WriterInfoDump(WI, stream);

	    DescriptorT Desc;
	    Desc.FillDescriptor(Reader);
	    Desc.Dump(stream);

	    if ( Options.showindex_flag )
	      Reader.DumpIndex(stream);
	  }
	else if ( result == RESULT_FORMAT && Options.showheader_flag )
	  {
	    Reader.DumpHeaderMetadata(stream);
	  }
      }

    return result;
  }